

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::ParsePartialFromString(MessageLite *this,string *data)

{
  int iVar1;
  byte bVar2;
  CodedInputStream local_58;
  
  local_58.buffer_ = (uint8 *)(data->_M_dataplus)._M_p;
  local_58.input_ = (ZeroCopyInputStream *)0x0;
  local_58.total_bytes_read_ = (int)data->_M_string_length;
  local_58.buffer_end_ = local_58.buffer_ + local_58.total_bytes_read_;
  local_58.overflow_bytes_ = 0;
  local_58.last_tag_ = 0;
  local_58.legitimate_message_end_ = false;
  local_58.aliasing_enabled_ = false;
  local_58.buffer_size_after_limit_ = 0;
  local_58.total_bytes_limit_ = 0x4000000;
  local_58.total_bytes_warning_threshold_ = 0x2000000;
  local_58.recursion_depth_ = 0;
  local_58.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
  local_58.extension_pool_ = (DescriptorPool *)0x0;
  local_58.extension_factory_ = (MessageFactory *)0x0;
  local_58.current_limit_ = local_58.total_bytes_read_;
  (*this->_vptr_MessageLite[4])();
  iVar1 = (*this->_vptr_MessageLite[8])(this,&local_58);
  bVar2 = (byte)iVar1 & local_58.legitimate_message_end_;
  io::CodedInputStream::~CodedInputStream(&local_58);
  return (bool)bVar2;
}

Assistant:

bool MessageLite::ParsePartialFromString(const string& data) {
  return InlineParsePartialFromArray(data.data(), data.size(), this);
}